

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void store_be64(uint8_t *p,uint64_t x)

{
  *(uint64_t *)p =
       x >> 0x38 | (x & 0xff000000000000) >> 0x28 | (x & 0xff0000000000) >> 0x18 |
       (x & 0xff00000000) >> 8 | (x & 0xff000000) << 8 | (x & 0xff0000) << 0x18 |
       (x & 0xff00) << 0x28 | x << 0x38;
  return;
}

Assistant:

static void
store_be64(uint8_t *p, uint64_t x)
{
	p[0] = (x >> 56) & 0xff;
	p[1] = (x >> 48) & 0xff;
	p[2] = (x >> 40) & 0xff;
	p[3] = (x >> 32) & 0xff;
	p[4] = (x >> 24) & 0xff;
	p[5] = (x >> 16) & 0xff;
	p[6] = (x >>  8) & 0xff;
	p[7] = (x >>  0) & 0xff;
}